

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

void __thiscall Potassco::AspifTextOutput::Data::convertToOutput(Data *this,StringMapNode node)

{
  char *pcVar1;
  ulong uVar2;
  StringMapNode node_local;
  uint32_t data [4];
  
  uVar2 = (ulong)node->second;
  if ((uVar2 != 0) &&
     (uVar2 < (ulong)((long)(this->atoms).
                            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->atoms).
                            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3))) {
    pcVar1 = (node->first)._M_dataplus._M_p;
    node_local = node;
    if (*pcVar1 == '&') {
      fail(-2,"void Potassco::AspifTextOutput::Data::convertToOutput(StringMapNode)",0x149,
           "node->first[0] != \'&\'","Redefinition: theory atom \'%u\' already defined as \'%s\'",
           uVar2,pcVar1,0);
    }
    setGenName(this,node->second);
    data[0] = 4;
    data[1] = (uint32_t)
              ((ulong)((long)(this->out).
                             super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->out).
                            super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
    data[2] = 1;
    data[3] = node->second;
    node->second = 0;
    std::
    vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
    ::push_back(&this->out,&node_local);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int*,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,
               (const_iterator)
               (this->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,data,(uint *)&stack0xffffffffffffffe8);
  }
  return;
}

Assistant:

void convertToOutput(StringMapNode node) {
		if (node->second && node->second < atoms.size()) {
			POTASSCO_REQUIRE(node->first[0] != '&', "Redefinition: theory atom '%u' already defined as '%s'", node->second, node->first.c_str());
			setGenName(node->second);
			uint32_t data[4] = {static_cast<uint32_t>(Directive_t::Output), static_cast<uint32_t>(out.size()), 1, node->second};
			node->second = 0;
			out.push_back(node);
			directives.insert(directives.end(), data, data + 4);
		}
	}